

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O3

void tree_pop(tree *t)

{
  char cVar1;
  tree_entry *__ptr;
  tree_entry *ptVar2;
  size_t sVar3;
  char *pcVar4;
  
  (t->path).s[t->dirname_length] = '\0';
  (t->path).length = t->dirname_length;
  __ptr = t->stack;
  ptVar2 = t->current;
  if (ptVar2 != (tree_entry *)0x0 && __ptr == ptVar2) {
    t->current = ptVar2->parent;
  }
  t->stack = __ptr->next;
  sVar3 = __ptr->dirname_length;
  t->dirname_length = sVar3;
  pcVar4 = (t->path).s + sVar3;
  do {
    t->basename = pcVar4;
    cVar1 = *pcVar4;
    pcVar4 = pcVar4 + 1;
  } while (cVar1 == '/');
  archive_string_free(&__ptr->name);
  free(__ptr);
  return;
}

Assistant:

static void
tree_pop(struct tree *t)
{
	struct tree_entry *te;

	t->path.s[t->dirname_length] = '\0';
	t->path.length = t->dirname_length;
	if (t->stack == t->current && t->current != NULL)
		t->current = t->current->parent;
	te = t->stack;
	t->stack = te->next;
	t->dirname_length = te->dirname_length;
	t->basename = t->path.s + t->dirname_length;
	while (t->basename[0] == '/')
		t->basename++;
	archive_string_free(&te->name);
	free(te);
}